

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QCache<QString,_QIcon>::Node>::erase
          (Data<QCache<QString,_QIcon>::Node> *this,Bucket bucket)

{
  byte bVar1;
  Span<QCache<QString,_QIcon>::Node> *pSVar2;
  ulong uVar3;
  Span<QCache<QString,_QIcon>::Node> *pSVar4;
  Span<QCache<QString,_QIcon>::Node> *pSVar5;
  size_t bucket_00;
  Span<QCache<QString,_QIcon>::Node> *this_00;
  Span<QCache<QString,_QIcon>::Node> *this_01;
  size_t fromIndex;
  QStringView QVar6;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QCache<QString,_QIcon>::Node>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  fromIndex = bucket_00;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      this_00 = this_00 + 1;
      if (((long)this_00 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        this_00 = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = this_00->offsets[fromIndex];
    uVar3 = (ulong)bVar1;
    if (uVar3 != 0xff) {
      QVar6.m_data = *(storage_type_conflict **)(this_00->entries[uVar3].storage.data + 0x18);
      QVar6.m_size = *(qsizetype *)(this_00->entries[uVar3].storage.data + 0x20);
      uVar3 = qHash(QVar6,this->seed);
      uVar3 = this->numBuckets - 1 & uVar3;
      pSVar4 = pSVar2 + (uVar3 >> 7);
      uVar3 = (ulong)((uint)uVar3 & 0x7f);
      if (uVar3 != fromIndex || pSVar4 != this_00) {
        do {
          if ((pSVar4 == this_01) && (uVar3 == bucket_00)) {
            if (this_00 == this_01) {
              this_01->offsets[bucket_00] = this_01->offsets[fromIndex];
              this_01->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            else {
              Span<QCache<QString,_QIcon>::Node>::moveFromSpan(this_01,this_00,fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            break;
          }
          uVar3 = uVar3 + 1;
          if (uVar3 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar4 = pSVar5;
            }
            uVar3 = 0;
          }
        } while ((pSVar4 != this_00) || (uVar3 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }